

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

SESSION_SEND_TRANSFER_RESULT
session_send_transfer
          (LINK_ENDPOINT_HANDLE link_endpoint,TRANSFER_HANDLE transfer,PAYLOAD *payloads,
          size_t payload_count,delivery_number *delivery_id,ON_SEND_COMPLETE on_send_complete,
          void *callback_context)

{
  SESSION_HANDLE pSVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  AMQP_VALUE pAVar5;
  size_t *psVar6;
  ulong uVar7;
  PAYLOAD *pPVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  SESSION_SEND_TRANSFER_RESULT SVar13;
  uint uVar14;
  ulong uVar15;
  ON_SEND_COMPLETE on_send_complete_00;
  bool bVar16;
  size_t encoded_size;
  uint local_78;
  uint local_74;
  AMQP_VALUE local_70;
  ulong local_68;
  uint local_5c;
  ON_SEND_COMPLETE local_58;
  ulong local_50;
  AMQP_VALUE local_48;
  int local_40 [2];
  PAYLOAD *local_38;
  
  if (transfer == (TRANSFER_HANDLE)0x0 || link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  pSVar1 = link_endpoint->session;
  if (pSVar1->session_state != SESSION_STATE_MAPPED) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  if (payload_count != 0) {
    psVar6 = &payloads->length;
    uVar4 = 0;
    sVar11 = payload_count;
    do {
      uVar10 = *psVar6;
      if (uVar10 >> 0x20 != 0) {
        return SESSION_SEND_TRANSFER_ERROR;
      }
      bVar16 = CARRY8(uVar4,uVar10);
      uVar4 = uVar4 + uVar10;
      if (bVar16) {
        return SESSION_SEND_TRANSFER_ERROR;
      }
      psVar6 = psVar6 + 2;
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
    if (uVar4 >> 0x20 != 0) {
      return SESSION_SEND_TRANSFER_ERROR;
    }
  }
  if (pSVar1->remote_incoming_window == 0) {
    return SESSION_SEND_TRANSFER_BUSY;
  }
  *delivery_id = pSVar1->next_outgoing_id;
  local_58 = on_send_complete;
  iVar3 = transfer_set_handle(transfer,link_endpoint->output_handle);
  if (iVar3 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  iVar3 = transfer_set_delivery_id(transfer,*delivery_id);
  if (iVar3 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  iVar3 = transfer_set_more(transfer,false);
  if (iVar3 != 0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  pAVar5 = amqpvalue_create_transfer(transfer);
  if (pAVar5 == (AMQP_VALUE)0x0) {
    return SESSION_SEND_TRANSFER_ERROR;
  }
  iVar3 = connection_get_remote_max_frame_size(pSVar1->connection,&local_78);
  SVar13 = SESSION_SEND_TRANSFER_ERROR;
  if ((iVar3 == 0) && (iVar3 = amqpvalue_get_encoded_size(pAVar5,(size_t *)local_40), iVar3 == 0)) {
    local_70 = pAVar5;
    if (payload_count == 0) {
      local_78 = (local_78 - local_40[0]) - 8;
    }
    else {
      psVar6 = &payloads->length;
      uVar4 = 0;
      sVar11 = payload_count;
      do {
        uVar4 = uVar4 + *psVar6;
        psVar6 = psVar6 + 2;
        sVar11 = sVar11 - 1;
      } while (sVar11 != 0);
      local_78 = (local_78 - local_40[0]) - 8;
      if (local_78 < uVar4) {
        local_68 = 0;
        local_74 = 0;
LAB_0015e1c3:
        local_50 = (ulong)local_78;
        uVar10 = uVar4 & 0xffffffff;
        if (local_78 < (uint)uVar4) {
          uVar10 = (ulong)local_78;
        }
        iVar3 = transfer_set_more(transfer,local_50 < uVar4);
        pAVar5 = local_70;
        if (iVar3 == 0) {
          local_48 = amqpvalue_create_transfer(transfer);
          uVar14 = (uint)uVar10;
          uVar7 = local_68;
          pAVar5 = local_70;
          uVar9 = local_74;
          if (local_48 != (AMQP_VALUE)0x0) {
            do {
              pPVar8 = payloads + uVar7;
              do {
                if ((int)uVar10 == 0) {
                  uVar10 = (uVar7 - local_68) + 1;
                  if (uVar10 == 0) {
                    uVar10 = 0xffffffffffffffff;
                  }
                  uVar15 = 0xffffffff;
                  if (uVar10 < 0xffffffff) {
                    uVar15 = uVar10;
                  }
                  local_5c = uVar14;
                  if (((uVar7 < local_68) || (0xfffffffe < uVar10)) ||
                     (pPVar8 = (PAYLOAD *)calloc(1,uVar15 << 4), pAVar5 = local_48,
                     pPVar8 == (PAYLOAD *)0x0)) {
                    amqpvalue_destroy(local_48);
                    pAVar5 = local_70;
                    goto LAB_0015e406;
                  }
                  if (local_5c != 0) {
                    lVar12 = 8;
                    uVar10 = 0;
                    uVar9 = local_5c;
                    goto LAB_0015e2c8;
                  }
                  sVar11 = 0;
                  goto LAB_0015e324;
                }
                uVar15 = (ulong)uVar9;
                uVar9 = uVar9 + (int)uVar10;
                bVar16 = uVar10 <= pPVar8->length - uVar15;
                uVar10 = 0;
              } while (bVar16);
              uVar7 = uVar7 + 1;
              uVar10 = (ulong)(uVar9 - (int)pPVar8->length);
              uVar9 = 0;
            } while( true );
          }
        }
        goto LAB_0015e406;
      }
    }
    iVar3 = connection_encode_frame
                      (pSVar1->endpoint,pAVar5,payloads,payload_count,local_58,callback_context);
    if (iVar3 == 0) {
      pSVar1->next_outgoing_id = pSVar1->next_outgoing_id + 1;
      pSVar1->remote_incoming_window = pSVar1->remote_incoming_window - 1;
      pSVar1->outgoing_window = pSVar1->outgoing_window - 1;
      SVar13 = SESSION_SEND_TRANSFER_OK;
    }
  }
LAB_0015e406:
  amqpvalue_destroy(pAVar5);
  return SVar13;
  while( true ) {
    lVar12 = lVar12 + 0x10;
    local_74 = 0;
    if (uVar15 <= uVar10) break;
LAB_0015e2c8:
    uVar7 = uVar10;
    lVar2 = *(long *)((long)&payloads[local_68].bytes + lVar12);
    uVar10 = lVar2 - (ulong)local_74;
    *(ulong *)((long)pPVar8 + lVar12 + -8) =
         (ulong)local_74 + *(long *)((long)payloads + lVar12 + local_68 * 0x10 + -8);
    if (uVar9 < uVar10) {
      *(ulong *)((long)&pPVar8->bytes + lVar12) = (ulong)uVar9;
      local_74 = local_74 + uVar9;
      uVar10 = uVar7;
      goto LAB_0015e31d;
    }
    *(ulong *)((long)&pPVar8->bytes + lVar12) = uVar10;
    uVar10 = uVar7 + 1;
    uVar9 = (uVar9 + local_74) - (int)lVar2;
    if (uVar9 == 0) break;
  }
  local_74 = 0;
LAB_0015e31d:
  local_68 = local_68 + uVar10;
  sVar11 = (size_t)((int)uVar7 + 1);
LAB_0015e324:
  on_send_complete_00 = local_58;
  if (local_50 < uVar4) {
    on_send_complete_00 = (ON_SEND_COMPLETE)0x0;
  }
  local_38 = pPVar8;
  iVar3 = connection_encode_frame
                    (pSVar1->endpoint,local_48,pPVar8,sVar11,on_send_complete_00,callback_context);
  local_50 = CONCAT44(local_50._4_4_,iVar3);
  free(local_38);
  amqpvalue_destroy(pAVar5);
  pAVar5 = local_70;
  if ((int)local_50 != 0) goto LAB_0015e406;
  uVar4 = uVar4 - local_5c;
  if (uVar4 == 0) goto code_r0x0015e386;
  goto LAB_0015e1c3;
code_r0x0015e386:
  pSVar1->next_outgoing_id = pSVar1->next_outgoing_id + 1;
  pSVar1->remote_incoming_window = pSVar1->remote_incoming_window - 1;
  pSVar1->outgoing_window = pSVar1->outgoing_window - 1;
  SVar13 = SESSION_SEND_TRANSFER_OK;
  goto LAB_0015e406;
}

Assistant:

SESSION_SEND_TRANSFER_RESULT session_send_transfer(LINK_ENDPOINT_HANDLE link_endpoint, TRANSFER_HANDLE transfer, PAYLOAD* payloads, size_t payload_count, delivery_number* delivery_id, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    SESSION_SEND_TRANSFER_RESULT result;

    /* Codes_S_R_S_SESSION_01_054: [If link_endpoint or transfer is NULL, session_send_transfer shall fail and return a non-zero value.] */
    if ((link_endpoint == NULL) ||
        (transfer == NULL))
    {
        result = SESSION_SEND_TRANSFER_ERROR;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)link_endpoint_instance->session;

        /* Codes_S_R_S_SESSION_01_059: [When session_send_transfer is called while the session is not in the MAPPED state, session_send_transfer shall fail and return a non-zero value.] */
        if (session_instance->session_state != SESSION_STATE_MAPPED)
        {
            result = SESSION_SEND_TRANSFER_ERROR;
        }
        else
        {
            size_t payload_size = 0;
            size_t i;

            for (i = 0; i < payload_count; i++)
            {
                if ((payloads[i].length > UINT32_MAX) ||
                    (payload_size + payloads[i].length < payload_size))
                {
                    break;
                }

                payload_size += payloads[i].length;
            }

            if ((i < payload_count) ||
                (payload_size > UINT32_MAX))
            {
                result = SESSION_SEND_TRANSFER_ERROR;
            }
            else
            {
                if (session_instance->remote_incoming_window == 0)
                {
                    result = SESSION_SEND_TRANSFER_BUSY;
                }
                else
                {
                    /* Codes_S_R_S_SESSION_01_012: [The session endpoint assigns each outgoing transfer frame an implicit transfer-id from a session scoped sequence.] */
                    /* Codes_S_R_S_SESSION_01_027: [sending a transfer Upon sending a transfer, the sending endpoint will increment its next-outgoing-id] */
                    *delivery_id = session_instance->next_outgoing_id;
                    if ((transfer_set_handle(transfer, link_endpoint_instance->output_handle) != 0) ||
                        (transfer_set_delivery_id(transfer, *delivery_id) != 0) ||
                        (transfer_set_more(transfer, false) != 0))
                    {
                        /* Codes_S_R_S_SESSION_01_058: [When any other error occurs, session_send_transfer shall fail and return a non-zero value.] */
                        result = SESSION_SEND_TRANSFER_ERROR;
                    }
                    else
                    {
                        AMQP_VALUE transfer_value;

                        transfer_value = amqpvalue_create_transfer(transfer);
                        if (transfer_value == NULL)
                        {
                            /* Codes_S_R_S_SESSION_01_058: [When any other error occurs, session_send_transfer shall fail and return a non-zero value.] */
                            result = SESSION_SEND_TRANSFER_ERROR;
                        }
                        else
                        {
                            uint32_t available_frame_size;
                            size_t encoded_size;

                            if ((connection_get_remote_max_frame_size(session_instance->connection, &available_frame_size) != 0) ||
                                (amqpvalue_get_encoded_size(transfer_value, &encoded_size) != 0))
                            {
                                result = SESSION_SEND_TRANSFER_ERROR;
                            }
                            else
                            {
                                payload_size = 0;

                                for (i = 0; i < payload_count; i++)
                                {
                                    payload_size += payloads[i].length;
                                }

                                available_frame_size -= (uint32_t)encoded_size;
                                available_frame_size -= 8;

                                if (available_frame_size >= payload_size)
                                {
                                    /* Codes_S_R_S_SESSION_01_055: [The encoding of the frame shall be done by calling connection_encode_frame and passing as arguments: the connection handle associated with the session, the transfer performative and the payload chunks passed to session_send_transfer.] */
                                    if (connection_encode_frame(session_instance->endpoint, transfer_value, payloads, payload_count, on_send_complete, callback_context) != 0)
                                    {
                                        /* Codes_S_R_S_SESSION_01_056: [If connection_encode_frame fails then session_send_transfer shall fail and return a non-zero value.] */
                                        result = SESSION_SEND_TRANSFER_ERROR;
                                    }
                                    else
                                    {
                                        /* Codes_S_R_S_SESSION_01_018: [is incremented after each successive transfer according to RFC-1982 [RFC1982] serial number arithmetic.] */
                                        session_instance->next_outgoing_id++;
                                        session_instance->remote_incoming_window--;
                                        session_instance->outgoing_window--;

                                        /* Codes_S_R_S_SESSION_01_053: [On success, session_send_transfer shall return 0.] */
                                        result = SESSION_SEND_TRANSFER_OK;
                                    }
                                }
                                else
                                {
                                    size_t current_payload_index = 0;
                                    uint32_t current_payload_pos = 0;

                                    /* break it down into different deliveries */
                                    while (payload_size > 0)
                                    {
                                        uint32_t transfer_frame_payload_count = 0;
                                        uint32_t current_transfer_frame_payload_size = (uint32_t)payload_size;
                                        uint32_t byte_counter;
                                        size_t temp_current_payload_index = current_payload_index;
                                        uint32_t temp_current_payload_pos = current_payload_pos;
                                        AMQP_VALUE multi_transfer_amqp_value;
                                        PAYLOAD* transfer_frame_payloads;
                                        bool more;

                                        if (current_transfer_frame_payload_size > available_frame_size)
                                        {
                                            current_transfer_frame_payload_size = available_frame_size;
                                        }

                                        if (available_frame_size >= payload_size)
                                        {
                                            more = false;
                                        }
                                        else
                                        {
                                            more = true;
                                        }

                                        if (transfer_set_more(transfer, more) != 0)
                                        {
                                            break;
                                        }

                                        multi_transfer_amqp_value = amqpvalue_create_transfer(transfer);
                                        if (multi_transfer_amqp_value == NULL)
                                        {
                                            break;
                                        }

                                        byte_counter = current_transfer_frame_payload_size;
                                        while (byte_counter > 0)
                                        {
                                            if (payloads[temp_current_payload_index].length - temp_current_payload_pos >= byte_counter)
                                            {
                                                /* more data than we need */
                                                temp_current_payload_pos += byte_counter;
                                                byte_counter = 0;
                                            }
                                            else
                                            {
                                                byte_counter -= (uint32_t)payloads[temp_current_payload_index].length - temp_current_payload_pos;
                                                temp_current_payload_index++;
                                                temp_current_payload_pos = 0;
                                            }
                                        }

                                        //transfer_frame_payload_len = (uint32_t)(temp_current_payload_index - current_payload_index + 1); // use safe int
                                        size_t payload_len = safe_subtract_size_t(temp_current_payload_index, current_payload_index);
                                        payload_len = safe_add_size_t(payload_len, 1);
                                        uint32_t transfer_frame_payload_len = payload_len < UINT32_MAX ? (uint32_t)payload_len : UINT32_MAX;

                                        if (transfer_frame_payload_len == UINT32_MAX ||
                                           (transfer_frame_payloads = (PAYLOAD*)calloc(1, (transfer_frame_payload_len * sizeof(PAYLOAD)))) == NULL)
                                        {
                                            amqpvalue_destroy(multi_transfer_amqp_value);
                                            break;
                                        }

                                        /* copy data */
                                        byte_counter = current_transfer_frame_payload_size;
                                        transfer_frame_payload_count = 0;

                                        while (byte_counter > 0 && transfer_frame_payload_count < transfer_frame_payload_len)
                                        {
                                            if (payloads[current_payload_index].length - current_payload_pos > byte_counter)
                                            {
                                                /* more data than we need */
                                                transfer_frame_payloads[transfer_frame_payload_count].bytes = payloads[current_payload_index].bytes + current_payload_pos;
                                                transfer_frame_payloads[transfer_frame_payload_count].length = byte_counter;
                                                current_payload_pos += byte_counter;
                                                byte_counter = 0;
                                            }
                                            else
                                            {
                                                /* copy entire payload and move to the next */
                                                transfer_frame_payloads[transfer_frame_payload_count].bytes = payloads[current_payload_index].bytes + current_payload_pos;
                                                transfer_frame_payloads[transfer_frame_payload_count].length = payloads[current_payload_index].length - current_payload_pos;
                                                byte_counter -= (uint32_t)payloads[current_payload_index].length - current_payload_pos;
                                                current_payload_index++;
                                                current_payload_pos = 0;
                                            }

                                            transfer_frame_payload_count++;
                                        }

                                        if (connection_encode_frame(session_instance->endpoint, multi_transfer_amqp_value, transfer_frame_payloads, transfer_frame_payload_count,
                                            /* only fire the send complete calllback on the last frame of the multi frame transfer */
                                            more ? NULL : on_send_complete,
                                            callback_context) != 0)
                                        {
                                            free(transfer_frame_payloads);
                                            amqpvalue_destroy(multi_transfer_amqp_value);
                                            break;
                                        }

                                        free(transfer_frame_payloads);
                                        amqpvalue_destroy(multi_transfer_amqp_value);
                                        payload_size -= current_transfer_frame_payload_size;
                                    }

                                    if (payload_size > 0)
                                    {
                                        result = SESSION_SEND_TRANSFER_ERROR;
                                    }
                                    else
                                    {
                                        /* Codes_S_R_S_SESSION_01_018: [is incremented after each successive transfer according to RFC-1982 [RFC1982] serial number arithmetic.] */
                                        session_instance->next_outgoing_id++;
                                        session_instance->remote_incoming_window--;
                                        session_instance->outgoing_window--;

                                        result = SESSION_SEND_TRANSFER_OK;
                                    }
                                }
                            }

                            amqpvalue_destroy(transfer_value);
                        }
                    }
                }
            }
        }
    }

    return result;
}